

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O0

int __thiscall
Yolact::detect(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects,
              string *targetName)

{
  double dVar1;
  bool bVar2;
  uchar uVar3;
  float *pfVar4;
  size_type sVar5;
  reference pvVar6;
  ulong uVar7;
  reference pvVar8;
  Mat *pMVar9;
  vector<Object,_std::allocator<Object>_> *in_RDX;
  long in_RSI;
  int x;
  uchar *bmp;
  float *mp2;
  int y;
  Mat mask2;
  int j_3;
  float *mp;
  float coeff;
  float *maskmap;
  int p_1;
  Mat mask_1;
  Object *obj_1;
  int i_3;
  int z;
  int j_2;
  vector<int,_std::allocator<int>_> picked;
  vector<Object,_std::allocator<Object>_> *candidates;
  int i_2;
  Object obj;
  float obj_y2;
  float obj_x2;
  float obj_y1;
  float obj_x1;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float var [4];
  float class_score;
  int j_1;
  float score;
  int label;
  float *maskdata;
  float *pb_1;
  float *loc;
  float *conf;
  int i_1;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  int keep_top_k;
  float nms_threshold;
  float confidence_thresh;
  float h;
  float w;
  float ar;
  int k;
  float cy;
  float cx;
  int j;
  int i;
  float scale;
  int conv_h;
  int conv_w;
  int p;
  float *pb;
  float scales [5];
  float aspect_ratios [3];
  int conv_hs [5];
  int conv_ws [5];
  Mat priorbox;
  int num_priors;
  int num_class;
  Mat confidence;
  Mat mask;
  Mat location;
  Mat maskmaps;
  Extractor ex;
  float norm_vals [3];
  float mean_vals [3];
  Mat in;
  int img_h;
  int img_w;
  int target_size;
  Net yolact;
  float *in_stack_00001700;
  float *in_stack_00001708;
  Mat *in_stack_00001710;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff7cc;
  Net *in_stack_fffffffffffff7d0;
  Object *this_00;
  value_type *in_stack_fffffffffffff7d8;
  Mat *in_stack_fffffffffffff7e0;
  Net *in_stack_fffffffffffff7e8;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffff7f0;
  allocator_type *in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff800;
  int in_stack_fffffffffffff804;
  int iVar11;
  float *in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  int in_stack_fffffffffffff820;
  Allocator *in_stack_fffffffffffff828;
  float *in_stack_fffffffffffff858;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff860;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffff868;
  Yolact *in_stack_fffffffffffff870;
  int local_72c;
  int local_714;
  Scalar_ local_710 [32];
  Mat local_6f0 [96];
  Size_<int> local_690;
  undefined1 local_688 [24];
  _InputArray local_670;
  Mat local_658 [100];
  int local_5f4;
  float local_5e4;
  string *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa5c;
  Yolact *in_stack_fffffffffffffa60;
  int local_594;
  Scalar_ local_590 [32];
  Mat local_570 [16];
  long local_560;
  reference local_510;
  int local_504;
  int local_500;
  int local_4fc;
  vector<int,_std::allocator<int>_> local_4f8;
  reference local_4e0;
  int local_4d8;
  Rect_<float> local_4b8;
  Rect_<float> local_4a8;
  int local_498;
  float local_494;
  float local_418;
  float local_414;
  float local_410;
  float local_40c;
  float local_408;
  float local_404;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  float local_3e8;
  float local_3e4;
  float local_3e0;
  float local_3dc;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  float local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a0;
  int local_39c;
  float local_398;
  int local_394;
  float *local_390;
  float *local_388;
  float *local_380;
  float *local_378;
  int local_36c;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  local_368;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  float local_340;
  float local_33c;
  float local_338;
  int local_334;
  float local_330;
  float local_32c;
  int local_328;
  int local_324;
  float local_320;
  int local_31c;
  int local_318;
  int local_314;
  float *local_310;
  float local_308 [8];
  uint local_2e8 [4];
  int local_2d8 [8];
  int local_2b8 [8];
  Mat local_298;
  int local_258;
  int local_254;
  Mat local_250;
  Mat local_210;
  Mat local_1d0;
  Mat local_190 [2];
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  int local_a8;
  int local_a4;
  undefined4 local_a0;
  undefined1 local_75;
  vector<Object,_std::allocator<Object>_> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ncnn::Net::Net(in_stack_fffffffffffff7d0);
  local_75 = 0;
  ncnn::Net::load_param(in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
  ncnn::Net::load_model(in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
  local_a0 = 0x226;
  local_a4 = *(int *)(local_10 + 0xc);
  local_a8 = *(int *)(local_10 + 8);
  this_00 = (Object *)0x0;
  uVar10 = 0x226;
  ncnn::Mat::from_pixels_resize
            ((uchar *)in_stack_fffffffffffff808,in_stack_fffffffffffff804,in_stack_fffffffffffff800,
             (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(int)in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff820,in_stack_fffffffffffff828);
  local_f8 = 0x42e98f5c42f75c29;
  local_f0 = 0x42cfe148;
  local_108 = 0x3c8f6ad93c8c4623;
  local_100 = 0x3c8ec47c;
  ncnn::Mat::substract_mean_normalize(in_stack_00001710,in_stack_00001708,in_stack_00001700);
  ncnn::Net::create_extractor((Net *)in_stack_fffffffffffff7d8);
  ncnn::Extractor::input
            ((Extractor *)in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (Mat *)in_stack_fffffffffffff7d8);
  ncnn::Mat::Mat(local_190);
  ncnn::Mat::Mat(&local_1d0);
  ncnn::Mat::Mat(&local_210);
  ncnn::Mat::Mat(&local_250);
  ncnn::Extractor::extract
            ((Extractor *)in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (Mat *)in_stack_fffffffffffff7d8);
  ncnn::Extractor::extract
            ((Extractor *)in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (Mat *)in_stack_fffffffffffff7d8);
  ncnn::Extractor::extract
            ((Extractor *)in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (Mat *)in_stack_fffffffffffff7d8);
  ncnn::Extractor::extract
            ((Extractor *)in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0,
             (Mat *)in_stack_fffffffffffff7d8);
  local_254 = local_250.w;
  local_258 = local_250.h;
  ncnn::Mat::Mat(in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                 (int)in_stack_fffffffffffff7d8,(size_t)this_00,
                 (Allocator *)CONCAT44(in_stack_fffffffffffff7cc,uVar10));
  local_2b8[0] = 0x45;
  local_2b8[1] = 0x23;
  local_2b8[2] = 0x12;
  local_2b8[3] = 9;
  local_2b8[4] = 5;
  local_2d8[0] = 0x45;
  local_2d8[1] = 0x23;
  local_2d8[2] = 0x12;
  local_2d8[3] = 9;
  local_2d8[4] = 5;
  local_2e8[0] = 0x3f800000;
  local_2e8[1] = 0x3f000000;
  local_2e8[2] = 0x40000000;
  local_308[0] = 24.0;
  local_308[1] = 48.0;
  local_308[2] = 96.0;
  local_308[3] = 192.0;
  local_308[4] = 384.0;
  local_310 = ncnn::Mat::operator_cast_to_float_(&local_298);
  for (local_314 = 0; local_314 < 5; local_314 = local_314 + 1) {
    local_318 = local_2b8[local_314];
    local_31c = local_2d8[local_314];
    local_320 = local_308[local_314];
    for (local_324 = 0; local_324 < local_31c; local_324 = local_324 + 1) {
      for (local_328 = 0; local_328 < local_318; local_328 = local_328 + 1) {
        local_32c = ((float)local_328 + 0.5) / (float)local_318;
        local_330 = ((float)local_324 + 0.5) / (float)local_31c;
        for (local_334 = 0; local_334 < 3; local_334 = local_334 + 1) {
          local_338 = (float)local_2e8[local_334];
          dVar1 = std::sqrt((double)(ulong)(uint)local_338);
          local_338 = SUB84(dVar1,0);
          local_340 = (local_320 * local_338) / 550.0;
          *local_310 = local_32c;
          local_310[1] = local_330;
          local_310[2] = local_340;
          local_310[3] = local_340;
          local_310 = local_310 + 4;
          local_33c = local_340;
        }
      }
    }
  }
  local_344 = 0x3e4ccccd;
  local_348 = 0x3f000000;
  local_34c = 200;
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::vector((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
            *)0x152222);
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::resize((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
            *)in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  for (local_36c = 0; local_36c < local_258; local_36c = local_36c + 1) {
    local_378 = ncnn::Mat::row(&local_250,local_36c);
    local_380 = ncnn::Mat::row(&local_1d0,local_36c);
    local_388 = ncnn::Mat::row(&local_298,local_36c);
    local_390 = ncnn::Mat::row(&local_210,local_36c);
    local_394 = 0;
    local_398 = 0.0;
    for (local_39c = 1; local_39c < local_254; local_39c = local_39c + 1) {
      local_3a0 = local_378[local_39c];
      if (local_398 < local_3a0) {
        local_394 = local_39c;
        local_398 = local_3a0;
      }
    }
    if (((local_394 != 0) && (0.2 < local_398)) &&
       (bVar2 = isTargetObj(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
                            in_stack_fffffffffffffa50), bVar2)) {
      local_3b8 = 0x3dcccccd3dcccccd;
      uStack_3b0 = 0x3e4ccccd3e4ccccd;
      local_3bc = *local_388;
      local_3c0 = local_388[1];
      local_3c4 = local_388[2];
      local_3c8 = local_388[3];
      local_3cc = *local_380 * 0.1 * local_3c4 + local_3bc;
      local_3d0 = local_380[1] * 0.1 * local_3c8 + local_3c0;
      dVar1 = std::exp((double)(ulong)(uint)(local_380[2] * 0.2));
      local_3d4 = SUB84(dVar1,0) * local_3c4;
      dVar1 = std::exp((double)(ulong)(uint)(uStack_3b0._4_4_ * local_380[3]));
      local_3d8 = SUB84(dVar1,0) * local_3c8;
      local_3dc = local_3cc - local_3d4 * 0.5;
      local_3e0 = local_3d0 - local_3d8 * 0.5;
      local_3e4 = local_3d4 * 0.5 + local_3cc;
      local_3e8 = local_3d8 * 0.5 + local_3d0;
      local_3ec = local_3dc * (float)*(int *)(local_10 + 0xc);
      local_3f0 = (float)(*(int *)(local_10 + 0xc) + -1);
      in_stack_fffffffffffff870 = (Yolact *)std::min<float>(&local_3ec,&local_3f0);
      local_3f4 = 0.0;
      in_stack_fffffffffffff868 =
           (vector<Object,_std::allocator<Object>_> *)
           std::max<float>((float *)in_stack_fffffffffffff870,&local_3f4);
      local_3dc = *(float *)&(in_stack_fffffffffffff868->
                             super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                             super__Vector_impl_data._M_start;
      local_3f8 = local_3e0 * (float)*(int *)(local_10 + 8);
      local_3fc = (float)(*(int *)(local_10 + 8) + -1);
      in_stack_fffffffffffff860 =
           (vector<int,_std::allocator<int>_> *)std::min<float>(&local_3f8,&local_3fc);
      local_400 = 0.0;
      in_stack_fffffffffffff858 = std::max<float>((float *)in_stack_fffffffffffff860,&local_400);
      local_3e0 = *in_stack_fffffffffffff858;
      local_404 = local_3e4 * (float)*(int *)(local_10 + 0xc);
      local_408 = (float)(*(int *)(local_10 + 0xc) + -1);
      pfVar4 = std::min<float>(&local_404,&local_408);
      local_40c = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_40c);
      local_3e4 = *pfVar4;
      local_410 = local_3e8 * (float)*(int *)(local_10 + 8);
      local_414 = (float)(*(int *)(local_10 + 8) + -1);
      pfVar4 = std::min<float>(&local_410,&local_414);
      local_418 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_418);
      local_3e8 = *pfVar4;
      Object::Object(this_00);
      cv::Rect_<float>::Rect_
                (&local_4b8,local_3dc,local_3e0,(local_3e4 - local_3dc) + 1.0,
                 (local_3e8 - local_3e0) + 1.0);
      cv::Rect_<float>::operator=(&local_4a8,&local_4b8);
      local_498 = local_394;
      local_494 = local_398;
      std::allocator<float>::allocator((allocator<float> *)0x152941);
      std::vector<float,std::allocator<float>>::vector<float_const*,void>
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                 in_stack_fffffffffffff808,
                 (float *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                 in_stack_fffffffffffff7f8);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff7e0,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff7d8);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff7e0);
      std::allocator<float>::~allocator((allocator<float> *)0x152990);
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::operator[](&local_368,(long)local_394);
      std::vector<Object,_std::allocator<Object>_>::push_back
                ((vector<Object,_std::allocator<Object>_> *)in_stack_fffffffffffff7e0,
                 in_stack_fffffffffffff7d8);
      Object::~Object(this_00);
    }
  }
  std::vector<Object,_std::allocator<Object>_>::clear
            ((vector<Object,_std::allocator<Object>_> *)0x152a30);
  local_4d8 = 0;
  while (iVar11 = local_4d8,
        sVar5 = std::
                vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                ::size(&local_368), iVar11 < (int)sVar5) {
    local_4e0 = std::
                vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                ::operator[](&local_368,(long)local_4d8);
    qsort_descent_inplace
              ((Yolact *)in_stack_fffffffffffff7e0,
               (vector<Object,_std::allocator<Object>_> *)in_stack_fffffffffffff7d8);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x152aa8);
    nms_sorted_bboxes(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                      (float)((ulong)in_stack_fffffffffffff858 >> 0x20));
    local_4fc = 0;
    while (iVar11 = local_4fc, sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_4f8),
          iVar11 < (int)sVar5) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_4f8,(long)local_4fc);
      local_500 = *pvVar6;
      std::vector<Object,_std::allocator<Object>_>::operator[](local_4e0,(long)local_500);
      std::vector<Object,_std::allocator<Object>_>::push_back
                ((vector<Object,_std::allocator<Object>_> *)in_stack_fffffffffffff7e0,
                 in_stack_fffffffffffff7d8);
      local_4fc = local_4fc + 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7e0);
    local_4d8 = local_4d8 + 1;
  }
  qsort_descent_inplace
            ((Yolact *)in_stack_fffffffffffff7e0,
             (vector<Object,_std::allocator<Object>_> *)in_stack_fffffffffffff7d8);
  sVar5 = std::vector<Object,_std::allocator<Object>_>::size(local_18);
  if (200 < (int)sVar5) {
    std::vector<Object,_std::allocator<Object>_>::resize
              (in_stack_fffffffffffff7f0,(size_type)in_stack_fffffffffffff7e8);
  }
  local_504 = 0;
  while( true ) {
    uVar7 = (ulong)local_504;
    sVar5 = std::vector<Object,_std::allocator<Object>_>::size(local_18);
    if (sVar5 <= uVar7) break;
    local_510 = std::vector<Object,_std::allocator<Object>_>::operator[](local_18,(long)local_504);
    cv::Mat::Mat(local_570,local_190[0].h,local_190[0].w,5);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)this_00,(double)CONCAT44(in_stack_fffffffffffff7cc,uVar10));
    cv::Mat::operator=(local_570,local_590);
    for (local_594 = 0; local_594 < local_190[0].c; local_594 = local_594 + 1) {
      ncnn::Mat::channel((Mat *)in_stack_fffffffffffff7d8,(int)((ulong)this_00 >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffa20);
      ncnn::Mat::~Mat((Mat *)0x152cef);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_510->maskdata,(long)local_594);
      local_5e4 = *pvVar8;
      for (local_5f4 = 0; local_5f4 < local_190[0].w * local_190[0].h; local_5f4 = local_5f4 + 1) {
        *(float *)(local_560 + (long)local_5f4 * 4) =
             pfVar4[local_5f4] * local_5e4 + *(float *)(local_560 + (long)local_5f4 * 4);
      }
    }
    cv::Mat::Mat(local_658);
    cv::_InputArray::_InputArray
              ((_InputArray *)this_00,(Mat *)CONCAT44(in_stack_fffffffffffff7cc,uVar10));
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)in_stack_fffffffffffff7e0,(Mat *)in_stack_fffffffffffff7d8);
    cv::Size_<int>::Size_(&local_690,local_a4,local_a8);
    cv::resize(0,&local_670,local_688,&local_690);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x152e94);
    cv::_InputArray::~_InputArray(&local_670);
    cv::Mat::Mat(local_6f0,local_a8,local_a4,0);
    cv::Mat::operator=(&local_510->mask,local_6f0);
    cv::Mat::~Mat(local_6f0);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)this_00,(double)CONCAT44(in_stack_fffffffffffff7cc,uVar10));
    cv::Mat::operator=(&local_510->mask,local_710);
    for (local_714 = 0; local_714 < local_a8; local_714 = local_714 + 1) {
      if (((local_510->rect).y <= (float)local_714) &&
         ((float)local_714 <= (local_510->rect).y + (local_510->rect).height)) {
        pMVar9 = (Mat *)cv::Mat::ptr<float_const>(local_658,local_714);
        in_stack_fffffffffffff7e0 = pMVar9;
        in_stack_fffffffffffff7d8 =
             (value_type *)cv::Mat::ptr<unsigned_char>(&local_510->mask,local_714);
        for (local_72c = 0; local_72c < local_a4; local_72c = local_72c + 1) {
          if (((local_510->rect).x <= (float)local_72c) &&
             ((float)local_72c <= (local_510->rect).x + (local_510->rect).width)) {
            uVar3 = false;
            if (0.5 < *(float *)((long)&pMVar9->data + (long)local_72c * 4)) {
              uVar3 = 0xff;
            }
            (&((Option *)&in_stack_fffffffffffff7d8->rect)->lightmode)[local_72c] = (bool)uVar3;
          }
        }
      }
    }
    cv::Mat::~Mat(local_658);
    cv::Mat::~Mat(local_570);
    local_504 = local_504 + 1;
  }
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::~vector((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
             *)in_stack_fffffffffffff7e0);
  ncnn::Mat::~Mat((Mat *)0x153191);
  ncnn::Mat::~Mat((Mat *)0x15319e);
  ncnn::Mat::~Mat((Mat *)0x1531ab);
  ncnn::Mat::~Mat((Mat *)0x1531b8);
  ncnn::Mat::~Mat((Mat *)0x1531c5);
  ncnn::Extractor::~Extractor((Extractor *)this_00);
  ncnn::Mat::~Mat((Mat *)0x1531df);
  ncnn::Net::~Net((Net *)this_00);
  return 0;
}

Assistant:

int Yolact::detect(cv::Mat& image, std::vector<Object>& objects, const std::string &targetName) 
{
    ncnn::Net yolact;

    yolact.opt.use_vulkan_compute = false;

    // original model converted from https://github.com/dbolya/yolact
    // yolact_resnet50_54_800000.pth
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    yolact.load_param("yolact.param");
    yolact.load_model("yolact.bin");

    const int target_size = 550;

    int img_w = image.cols;
    int img_h = image.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(image.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h, target_size, target_size);

    const float mean_vals[3] = {123.68f, 116.78f, 103.94f};
    const float norm_vals[3] = {1.0 / 58.40f, 1.0 / 57.12f, 1.0 / 57.38f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = yolact.create_extractor();
    //     ex.set_num_threads(4);

    ex.input("input.1", in);

    ncnn::Mat maskmaps;
    ncnn::Mat location;
    ncnn::Mat mask;
    ncnn::Mat confidence;

    ex.extract("619", maskmaps); // 138x138 x 32

    ex.extract("816", location);   // 4 x 19248
    ex.extract("818", mask);       // maskdim 32 x 19248
    ex.extract("820", confidence); // 81 x 19248

    int num_class = confidence.w;
    int num_priors = confidence.h;

    // make priorbox
    ncnn::Mat priorbox(4, num_priors);
    {
        const int conv_ws[5] = {69, 35, 18, 9, 5};
        const int conv_hs[5] = {69, 35, 18, 9, 5};

        const float aspect_ratios[3] = {1.f, 0.5f, 2.f};
        const float scales[5] = {24.f, 48.f, 96.f, 192.f, 384.f};

        float* pb = priorbox;

        for (int p = 0; p < 5; p++)
        {
            int conv_w = conv_ws[p];
            int conv_h = conv_hs[p];

            float scale = scales[p];

            for (int i = 0; i < conv_h; i++)
            {
                for (int j = 0; j < conv_w; j++)
                {
                    // +0.5 because priors are in center-size notation
                    float cx = (j + 0.5f) / conv_w;
                    float cy = (i + 0.5f) / conv_h;

                    for (int k = 0; k < 3; k++)
                    {
                        float ar = aspect_ratios[k];

                        ar = sqrt(ar);

                        float w = scale * ar / 550;
                        float h = scale / ar / 550;

                        // This is for backward compatability with a bug where I made everything square by accident
                        // cfg.backbone.use_square_anchors:
                        h = w;

                        pb[0] = cx;
                        pb[1] = cy;
                        pb[2] = w;
                        pb[3] = h;

                        pb += 4;
                    }
                }
            }
        }
    }

    const float confidence_thresh = 0.2f;
    const float nms_threshold = 0.5f;
    const int keep_top_k = 200;

    std::vector<std::vector<Object> > class_candidates;
    class_candidates.resize(num_class);

    for (int i = 0; i < num_priors; i++)
    {
        const float* conf = confidence.row(i);
        const float* loc = location.row(i);
        const float* pb = priorbox.row(i);
        const float* maskdata = mask.row(i);

        // find class id with highest score
        // start from 1 to skip background
        int label = 0;
        float score = 0.f;
        for (int j = 1; j < num_class; j++)
        {
            float class_score = conf[j];
            if (class_score > score)
            {
                label = j;
                score = class_score;
            }
        }

        // ignore background or low score
        if (label == 0 || score <= confidence_thresh || !isTargetObj(label, targetName))
            continue;

        // CENTER_SIZE
        float var[4] = {0.1f, 0.1f, 0.2f, 0.2f};

        float pb_cx = pb[0];
        float pb_cy = pb[1];
        float pb_w = pb[2];
        float pb_h = pb[3];

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = (float)(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = (float)(exp(var[3] * loc[3]) * pb_h);

        float obj_x1 = bbox_cx - bbox_w * 0.5f;
        float obj_y1 = bbox_cy - bbox_h * 0.5f;
        float obj_x2 = bbox_cx + bbox_w * 0.5f;
        float obj_y2 = bbox_cy + bbox_h * 0.5f;

        // clip
        obj_x1 = std::max(std::min(obj_x1 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y1 = std::max(std::min(obj_y1 * image.rows, (float)(image.rows - 1)), 0.f);
        obj_x2 = std::max(std::min(obj_x2 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y2 = std::max(std::min(obj_y2 * image.rows, (float)(image.rows - 1)), 0.f);

        // append object
        Object obj;
        obj.rect = cv::Rect_<float>(obj_x1, obj_y1, obj_x2 - obj_x1 + 1, obj_y2 - obj_y1 + 1);
        obj.label = label;
        obj.prob = score;
        obj.maskdata = std::vector<float>(maskdata, maskdata + mask.w);

        class_candidates[label].push_back(obj);
    }

    objects.clear();
    for (int i = 0; i < (int)class_candidates.size(); i++)
    {
        std::vector<Object>& candidates = class_candidates[i];

        qsort_descent_inplace(candidates);

        std::vector<int> picked;
        nms_sorted_bboxes(candidates, picked, nms_threshold);

        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            objects.push_back(candidates[z]);
        }
    }

    qsort_descent_inplace(objects);

    // keep_top_k
    if (keep_top_k < (int)objects.size())
    {
        objects.resize(keep_top_k);
    }

    // generate mask
    for (int i = 0; i < objects.size(); i++)
    {
        Object& obj = objects[i];

        cv::Mat mask(maskmaps.h, maskmaps.w, CV_32FC1);
        {
            mask = cv::Scalar(0.f);

            for (int p = 0; p < maskmaps.c; p++)
            {
                const float* maskmap = maskmaps.channel(p);
                float coeff = obj.maskdata[p];
                float* mp = (float*)mask.data;

                // mask += m * coeff
                for (int j = 0; j < maskmaps.w * maskmaps.h; j++)
                {
                    mp[j] += maskmap[j] * coeff;
                }
            }
        }

        cv::Mat mask2;
        cv::resize(mask, mask2, cv::Size(img_w, img_h));

        // crop obj box and binarize
        obj.mask = cv::Mat(img_h, img_w, CV_8UC1);
        {
            obj.mask = cv::Scalar(0);

            for (int y = 0; y < img_h; y++)
            {
                if (y < obj.rect.y || y > obj.rect.y + obj.rect.height)
                    continue;

                const float* mp2 = mask2.ptr<const float>(y);
                uchar* bmp = obj.mask.ptr<uchar>(y);

                for (int x = 0; x < img_w; x++)
                {
                    if (x < obj.rect.x || x > obj.rect.x + obj.rect.width)
                        continue;

                    bmp[x] = mp2[x] > 0.5f ? 255 : 0;
                }
            }
        }
    }

    return 0;    
}